

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::printInfo(Autotune *this,double maxDuration)

{
  bool bVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  double *pdVar4;
  ostream *poVar5;
  ostream *this_00;
  ClockPrint *in_RDI;
  double in_XMM0_Qa;
  int32_t eta;
  double progress;
  ostream *in_stack_ffffffffffffff80;
  ostream *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int __args_1;
  ostream *in_stack_ffffffffffffff98;
  function<void_(double,_int,_double,_double)> *in_stack_ffffffffffffffa0;
  ClockPrint in_stack_ffffffffffffffb0;
  double local_38;
  double local_30;
  int local_24;
  double local_20;
  double local_18;
  double local_10;
  
  __args_1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_18 = *(double *)(in_RDI + 2) / in_XMM0_Qa;
  local_20 = 1.0;
  local_10 = in_XMM0_Qa;
  pdVar4 = std::min<double>(&local_18,&local_20);
  local_18 = *pdVar4;
  local_30 = local_10 - *(double *)(in_RDI + 2);
  local_38 = 0.0;
  pdVar4 = std::max<double>(&local_30,&local_38);
  local_24 = (int)*pdVar4;
  if (0 < in_RDI[0x16].duration_) {
    std::operator<<((ostream *)&std::cerr,"\r");
    std::ostream::operator<<(&std::cerr,std::fixed);
    std::operator<<((ostream *)&std::cerr,"Progress: ");
    _Var2 = std::setprecision(1);
    in_stack_ffffffffffffff88 = std::operator<<((ostream *)&std::cerr,_Var2);
    _Var3 = std::setw(5);
    poVar5 = std::operator<<(in_stack_ffffffffffffff88,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18 * 100.0);
    std::operator<<(poVar5,"%");
    poVar5 = std::operator<<((ostream *)&std::cerr," Trials: ");
    _Var3 = std::setw(4);
    this_00 = std::operator<<(poVar5,_Var3);
    __args_1 = (int)((ulong)poVar5 >> 0x20);
    std::ostream::operator<<(this_00,in_RDI[6].duration_);
    in_stack_ffffffffffffff98 = std::operator<<((ostream *)&std::cerr," Best score: ");
    _Var3 = std::setw(9);
    in_stack_ffffffffffffffa0 =
         (function<void_(double,_int,_double,_double)> *)
         std::operator<<(in_stack_ffffffffffffff98,_Var3);
    _Var2 = std::setprecision(6);
    std::operator<<((ostream *)in_stack_ffffffffffffffa0,_Var2);
    if ((*(double *)(in_RDI + 4) != -1.0) || (NAN(*(double *)(in_RDI + 4)))) {
      std::ostream::operator<<(&std::cerr,*(double *)(in_RDI + 4));
    }
    else {
      std::operator<<((ostream *)&std::cerr,"unknown");
    }
    in_stack_ffffffffffffff80 = std::operator<<((ostream *)&std::cerr," ETA: ");
    utils::ClockPrint::ClockPrint((ClockPrint *)&stack0xffffffffffffffb0,local_24);
    utils::operator<<((ostream *)CONCAT44(_Var2._M_n,in_stack_ffffffffffffffb0.duration_),in_RDI);
    std::ostream::operator<<(&std::cerr,std::flush<char,std::char_traits<char>>);
  }
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(double,_int,_double,_double)> *)0x19f0a6);
  if (bVar1) {
    std::function<void_(double,_int,_double,_double)>::operator()
              (in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,__args_1,
               (double)in_stack_ffffffffffffff88,(double)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void Autotune::printInfo(double maxDuration) {
  double progress = elapsed_ / maxDuration;
  progress = std::min(progress, 1.0);
  int32_t eta = (int32_t)std::max(maxDuration - elapsed_, 0.0);

  if (this->verbose_ > 0)
  {
      std::cerr << "\r";
      std::cerr << std::fixed;
      std::cerr << "Progress: ";
      std::cerr << std::setprecision(1) << std::setw(5) << progress * 100 << "%";
      std::cerr << " Trials: " << std::setw(4) << trials_;
      std::cerr << " Best score: " << std::setw(9) << std::setprecision(6);
      if (bestScore_ == kUnknownBestScore) {
          std::cerr << "unknown";
      }
      else {
          std::cerr << bestScore_;
      }

      std::cerr << " ETA: "
                << utils::ClockPrint(eta);
      std::cerr << std::flush;
  }

  if (this->callback_)
  {
      this->callback_(progress, trials_, bestScore_, eta);
  }
}